

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

double GetCostModelMinCost(CostModelFun *costmodel,void *costcontext)

{
  undefined8 in_RSI;
  code *in_RDI;
  double dVar1;
  double c_1;
  double c;
  int i;
  int bestdist;
  int bestlength;
  double mincost;
  int local_24;
  int local_20;
  int local_1c;
  double local_18;
  
  local_1c = 0;
  local_20 = 0;
  local_18 = 1e+30;
  for (local_24 = 3; local_24 < 0x103; local_24 = local_24 + 1) {
    dVar1 = (double)(*in_RDI)(local_24,1,in_RSI);
    if (dVar1 < local_18) {
      local_1c = local_24;
      local_18 = dVar1;
    }
  }
  local_18 = 1e+30;
  for (local_24 = 0; local_24 < 0x1e; local_24 = local_24 + 1) {
    dVar1 = (double)(*in_RDI)(3,GetCostModelMinCost::dsymbols[local_24],in_RSI);
    if (dVar1 < local_18) {
      local_20 = GetCostModelMinCost::dsymbols[local_24];
      local_18 = dVar1;
    }
  }
  dVar1 = (double)(*in_RDI)(local_1c,local_20,in_RSI);
  return dVar1;
}

Assistant:

static double GetCostModelMinCost(CostModelFun* costmodel, void* costcontext) {
  double mincost;
  int bestlength = 0; /* length that has lowest cost in the cost model */
  int bestdist = 0; /* distance that has lowest cost in the cost model */
  int i;
  /*
  Table of distances that have a different distance symbol in the deflate
  specification. Each value is the first distance that has a new symbol. Only
  different symbols affect the cost model so only these need to be checked.
  See RFC 1951 section 3.2.5. Compressed blocks (length and distance codes).
  */
  static const int dsymbols[30] = {
    1, 2, 3, 4, 5, 7, 9, 13, 17, 25, 33, 49, 65, 97, 129, 193, 257, 385, 513,
    769, 1025, 1537, 2049, 3073, 4097, 6145, 8193, 12289, 16385, 24577
  };

  mincost = ZOPFLI_LARGE_FLOAT;
  for (i = 3; i < 259; i++) {
    double c = costmodel(i, 1, costcontext);
    if (c < mincost) {
      bestlength = i;
      mincost = c;
    }
  }

  mincost = ZOPFLI_LARGE_FLOAT;
  for (i = 0; i < 30; i++) {
    double c = costmodel(3, dsymbols[i], costcontext);
    if (c < mincost) {
      bestdist = dsymbols[i];
      mincost = c;
    }
  }

  return costmodel(bestlength, bestdist, costcontext);
}